

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

Rhs * __thiscall
Lib::
SkipList<Inferences::ALASCA::Demodulation::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator>
::pop(SkipList<Inferences::ALASCA::Demodulation::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator>
      *this)

{
  uint64_t *puVar1;
  long *in_RSI;
  Node *in_RDI;
  uint i;
  uint h;
  Node *node;
  uint in_stack_ffffffffffffffcc;
  uint local_18;
  uint local_14;
  
  puVar1 = *(uint64_t **)(*in_RSI + 0x20);
  local_14 = 1;
  while ((local_14 < *(uint *)(in_RSI + 1) &&
         (*(uint64_t **)(*in_RSI + 0x20 + (ulong)local_14 * 8) == puVar1))) {
    local_14 = local_14 + 1;
  }
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    *(uint64_t *)(*in_RSI + 0x20 + (ulong)local_18 * 8) = puVar1[(ulong)local_18 + 4];
  }
  (in_RDI->value).term.super_TermList._content = *puVar1;
  (in_RDI->value).term._sort._content = puVar1[1];
  *(uint64_t *)&(in_RDI->value).ordOptimization = puVar1[2];
  (in_RDI->value).clause = (Clause *)puVar1[3];
  deallocate(in_RDI,in_stack_ffffffffffffffcc);
  return &in_RDI->value;
}

Assistant:

Value pop()
  {
    ASS(isNonEmpty());

    // find the height of the first
    Node* node = _left->nodes[0];
    unsigned h;
    for (h = 1;h < _top;h++) {
      if (_left->nodes[h] != node) {
	break;
      }
    }
    // the height of the first node is h-1
    for (unsigned i = 0;i < h;i++) {
      _left->nodes[i] = node->nodes[i];
    }
    Value val = node->value;
    deallocate(node,h-1);
    return val;
  }